

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O1

bool SaveError(char **errptr,Status *s)

{
  char *pcVar1;
  char *pcVar2;
  string local_40;
  
  if (errptr != (char **)0x0) {
    pcVar1 = s->state_;
    if (pcVar1 != (char *)0x0) {
      if (*errptr != (char *)0x0) {
        free(*errptr);
      }
      leveldb::Status::ToString_abi_cxx11_(&local_40,s);
      pcVar2 = strdup(local_40._M_dataplus._M_p);
      *errptr = pcVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
    return pcVar1 != (char *)0x0;
  }
  __assert_fail("errptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/c.cc"
                ,0x92,"bool SaveError(char **, const Status &)");
}

Assistant:

static bool SaveError(char** errptr, const Status& s) {
  assert(errptr != nullptr);
  if (s.ok()) {
    return false;
  } else if (*errptr == nullptr) {
    *errptr = strdup(s.ToString().c_str());
  } else {
    // TODO(sanjay): Merge with existing error?
    free(*errptr);
    *errptr = strdup(s.ToString().c_str());
  }
  return true;
}